

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O3

UStringTrieResult __thiscall
icu_63::BytesTrie::nextImpl(BytesTrie *this,uint8_t *pos,int32_t inByte)

{
  byte bVar1;
  byte *pbVar2;
  UStringTrieResult UVar3;
  byte *pos_00;
  
  bVar1 = *pos;
  pbVar2 = pos + 1;
  while( true ) {
    pos_00 = pbVar2;
    if (bVar1 < 0x10) {
      UVar3 = branchNext(this,pos_00,(uint)bVar1,inByte);
      return UVar3;
    }
    if (bVar1 < 0x20) break;
    if ((bVar1 & 1) != 0) goto LAB_002fd535;
    if (0xa1 < bVar1) {
      if (bVar1 < 0xd8) {
        pos_00 = pos + 2;
      }
      else if (bVar1 < 0xfc) {
        pos_00 = pos + 3;
      }
      else {
        pos_00 = pos_00 + (ulong)((bVar1 >> 1 & 1) != 0) + 3;
      }
    }
    bVar1 = *pos_00;
    pbVar2 = pos_00 + 1;
    pos = pos_00;
  }
  if ((uint)*pos_00 == inByte) {
    this->remainingMatchLength_ = bVar1 - 0x11;
    this->pos_ = pos + 2;
    if (bVar1 != 0x10) {
      return USTRINGTRIE_NO_VALUE;
    }
    UVar3 = (UStringTrieResult)pos[2];
    if (UVar3 < 0x20) {
      return USTRINGTRIE_NO_VALUE;
    }
    return UVar3 & USTRINGTRIE_NO_VALUE ^ USTRINGTRIE_INTERMEDIATE_VALUE;
  }
LAB_002fd535:
  this->pos_ = (uint8_t *)0x0;
  return USTRINGTRIE_NO_MATCH;
}

Assistant:

UStringTrieResult
BytesTrie::nextImpl(const uint8_t *pos, int32_t inByte) {
    for(;;) {
        int32_t node=*pos++;
        if(node<kMinLinearMatch) {
            return branchNext(pos, node, inByte);
        } else if(node<kMinValueLead) {
            // Match the first of length+1 bytes.
            int32_t length=node-kMinLinearMatch;  // Actual match length minus 1.
            if(inByte==*pos++) {
                remainingMatchLength_=--length;
                pos_=pos;
                return (length<0 && (node=*pos)>=kMinValueLead) ?
                        valueResult(node) : USTRINGTRIE_NO_VALUE;
            } else {
                // No match.
                break;
            }
        } else if(node&kValueIsFinal) {
            // No further matching bytes.
            break;
        } else {
            // Skip intermediate value.
            pos=skipValue(pos, node);
            // The next node must not also be a value node.
            U_ASSERT(*pos<kMinValueLead);
        }
    }
    stop();
    return USTRINGTRIE_NO_MATCH;
}